

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O1

void __thiscall
chrono::ChConstraintThreeBBShaft::ChConstraintThreeBBShaft
          (ChConstraintThreeBBShaft *this,ChVariablesBody *mvariables_a,
          ChVariablesBody *mvariables_b,ChVariables *mvariables_c)

{
  int iVar1;
  
  (this->super_ChConstraintThree).super_ChConstraint.c_i = 0.0;
  (this->super_ChConstraintThree).super_ChConstraint.l_i = 0.0;
  (this->super_ChConstraintThree).super_ChConstraint.b_i = 0.0;
  (this->super_ChConstraintThree).super_ChConstraint.cfm_i = 0.0;
  (this->super_ChConstraintThree).super_ChConstraint.valid = false;
  (this->super_ChConstraintThree).super_ChConstraint.disabled = false;
  (this->super_ChConstraintThree).super_ChConstraint.redundant = false;
  (this->super_ChConstraintThree).super_ChConstraint.broken = false;
  (this->super_ChConstraintThree).super_ChConstraint.active = true;
  (this->super_ChConstraintThree).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->super_ChConstraintThree).super_ChConstraint.g_i = 0.0;
  (this->super_ChConstraintThree).variables_a = (ChVariables *)SUB168(ZEXT416(0) << 0x40,0);
  (this->super_ChConstraintThree).variables_b = (ChVariables *)SUB168(ZEXT416(0) << 0x40,8);
  (this->super_ChConstraintThree).variables_c = (ChVariables *)0x0;
  (this->super_ChConstraintThree).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraint_00b63240;
  iVar1 = (*mvariables_c->_vptr_ChVariables[2])(mvariables_c);
  if (iVar1 == 1) {
    (*(this->super_ChConstraintThree).super_ChConstraint._vptr_ChConstraint[0x17])
              (this,mvariables_a,mvariables_b,mvariables_c);
    return;
  }
  __assert_fail("mvariables_c->Get_ndof() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChConstraintThreeBBShaft.cpp"
                ,0x19,
                "chrono::ChConstraintThreeBBShaft::ChConstraintThreeBBShaft(ChVariablesBody *, ChVariablesBody *, ChVariables *)"
               );
}

Assistant:

ChConstraintThreeBBShaft::ChConstraintThreeBBShaft(ChVariablesBody* mvariables_a,
                                                   ChVariablesBody* mvariables_b,
                                                   ChVariables* mvariables_c) {
    assert(mvariables_c->Get_ndof() == 1);
    SetVariables(mvariables_a, mvariables_b, mvariables_c);
}